

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O2

void __thiscall
AddressFactory_ParseOutputDescriptor_Test::TestBody(AddressFactory_ParseOutputDescriptor_Test *this)

{
  byte bVar1;
  long lVar2;
  DescriptorScriptData *this_00;
  char *pcVar3;
  char *pcVar4;
  pointer pTVar5;
  initializer_list<TestCfdAddressFactoryDescriptorData> __l;
  allocator_type local_13a3;
  allocator local_13a2;
  allocator local_13a1;
  allocator local_13a0;
  allocator local_139f;
  allocator local_139e;
  allocator local_139d;
  allocator local_139c;
  allocator local_139b;
  allocator local_139a;
  allocator local_1399;
  allocator local_1398;
  allocator local_1397;
  allocator local_1396;
  allocator local_1395;
  allocator local_1394;
  allocator local_1393;
  allocator local_1392;
  allocator local_1391;
  allocator local_1390;
  allocator local_138f;
  allocator local_138e;
  allocator local_138d;
  allocator local_138c;
  allocator local_138b;
  allocator local_138a;
  allocator local_1389;
  allocator local_1388;
  allocator local_1387;
  allocator local_1386;
  allocator local_1385;
  allocator local_1384;
  allocator local_1383;
  allocator local_1382;
  allocator local_1381;
  allocator local_1380;
  allocator local_137f;
  allocator local_137e;
  allocator local_137d;
  allocator local_137c;
  allocator local_137b;
  allocator local_137a;
  allocator local_1379;
  allocator local_1378;
  allocator local_1377;
  allocator local_1376;
  allocator local_1375;
  allocator local_1374;
  allocator local_1373;
  allocator local_1372;
  allocator local_1371;
  allocator local_1370;
  allocator local_136f;
  allocator local_136e;
  allocator local_136d;
  allocator local_136c;
  allocator local_136b;
  allocator local_136a;
  allocator local_1369;
  allocator local_1368;
  allocator local_1367;
  allocator local_1366;
  allocator local_1365;
  allocator local_1364;
  allocator local_1363;
  allocator local_1362;
  allocator local_1361;
  allocator local_1360;
  allocator local_135f;
  allocator local_135e;
  allocator local_135d;
  allocator local_135c;
  allocator local_135b;
  allocator local_135a;
  allocator local_1359;
  allocator local_1358;
  allocator local_1357;
  allocator local_1356;
  allocator local_1355;
  allocator local_1354;
  allocator local_1353;
  allocator local_1352;
  allocator local_1351;
  allocator local_1350;
  allocator local_134f;
  allocator local_134e;
  allocator local_134d;
  allocator local_134c;
  allocator local_134b;
  allocator local_134a;
  allocator local_1349;
  AssertionResult gtest_ar_1;
  AddressFactory factory;
  AssertHelper local_12f8;
  undefined1 local_12f0 [8];
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  g_test_cfd_descriptor_data;
  TestCfdAddressFactoryDescriptorData test_data;
  AssertionResult gtest_ar;
  DescriptorScriptData data;
  string local_b58 [32];
  string local_b38 [32];
  undefined4 local_b18;
  string local_b10 [32];
  undefined8 local_af0;
  string local_ae8 [32];
  undefined4 local_ac8;
  string local_ac0 [32];
  undefined4 local_aa0;
  string local_a98 [32];
  undefined4 local_a78;
  string local_a70 [32];
  string local_a50 [32];
  undefined4 local_a30;
  string local_a28 [32];
  undefined8 local_a08;
  string local_a00 [32];
  undefined4 local_9e0;
  string local_9d8 [32];
  undefined4 local_9b8;
  string local_9b0 [32];
  undefined4 local_990;
  string local_988 [32];
  string local_968 [32];
  undefined4 local_948;
  string local_940 [32];
  undefined8 local_920;
  string local_918 [32];
  undefined4 local_8f8;
  string local_8f0 [32];
  undefined4 local_8d0;
  string local_8c8 [32];
  undefined4 local_8a8;
  string local_8a0 [32];
  string local_880 [32];
  undefined4 local_860;
  string local_858 [32];
  undefined8 local_838;
  string local_830 [32];
  undefined4 local_810;
  string local_808 [32];
  undefined4 local_7e8;
  string local_7e0 [32];
  undefined4 local_7c0;
  string local_7b8 [32];
  string local_798 [32];
  undefined4 local_778;
  string local_770 [32];
  undefined8 local_750;
  string local_748 [32];
  undefined4 local_728;
  string local_720 [32];
  undefined4 local_700;
  string local_6f8 [32];
  undefined4 local_6d8;
  string local_6d0 [32];
  string local_6b0 [32];
  undefined4 local_690;
  string local_688 [32];
  undefined8 local_668;
  string local_660 [32];
  undefined4 local_640;
  string local_638 [32];
  undefined4 local_618;
  string local_610 [32];
  undefined4 local_5f0;
  string local_5e8 [32];
  string local_5c8 [32];
  undefined4 local_5a8;
  string local_5a0 [32];
  undefined8 local_580;
  string local_578 [32];
  undefined4 local_558;
  string local_550 [32];
  undefined4 local_530;
  string local_528 [32];
  undefined4 local_508;
  string local_500 [32];
  string local_4e0 [32];
  undefined4 local_4c0;
  string local_4b8 [32];
  undefined8 local_498;
  string local_490 [32];
  undefined4 local_470;
  string local_468 [32];
  undefined4 local_448;
  string local_440 [32];
  undefined4 local_420;
  string local_418 [32];
  string local_3f8 [32];
  undefined4 local_3d8;
  string local_3d0 [32];
  undefined8 local_3b0;
  string local_3a8 [32];
  undefined4 local_388;
  string local_380 [32];
  undefined4 local_360;
  string local_358 [32];
  undefined4 local_338;
  string local_330 [32];
  string local_310 [32];
  undefined4 local_2f0;
  string local_2e8 [32];
  undefined8 local_2c8;
  string local_2c0 [32];
  undefined4 local_2a0;
  string local_298 [32];
  undefined4 local_278;
  string local_270 [32];
  undefined4 local_250;
  string local_248 [32];
  string local_228 [32];
  undefined4 local_208;
  string local_200 [32];
  undefined8 local_1e0;
  string local_1d8 [32];
  undefined4 local_1b8;
  string local_1b0 [32];
  undefined4 local_190;
  string local_188 [32];
  undefined4 local_168;
  string local_160 [32];
  string local_140 [32];
  undefined4 local_120;
  string local_118 [32];
  undefined8 local_f8;
  string local_f0 [32];
  undefined4 local_d0;
  string local_c8 [32];
  undefined4 local_a8;
  string local_a0 [32];
  undefined4 local_80;
  string local_78 [32];
  string local_58 [32];
  undefined4 local_38;
  
  std::__cxx11::string::string
            ((string *)&data,
             "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
             (allocator *)&gtest_ar);
  data.locking_script.script_data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x300000000;
  std::__cxx11::string::string
            ((string *)&data.locking_script.script_stack_,
             "2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
             (allocator *)&test_data);
  data.address = (Address)0x0;
  data._73_3_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x50,"1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",(allocator *)&factory);
  data._112_4_ = 1;
  std::__cxx11::string::string((string *)&data.field_0x78,"",(allocator *)&gtest_ar_1);
  data._152_4_ = 1;
  std::__cxx11::string::string
            ((string *)&data.field_0xa0,
             "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
             (allocator *)local_12f0);
  std::__cxx11::string::string((string *)&data.field_0xc0,"",(allocator *)&local_12f8);
  data._224_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0xe8,
             "pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",&local_1349);
  data._264_8_ = 0x400000000;
  std::__cxx11::string::string
            ((string *)&data.field_0x110,"76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",
             &local_134a);
  data._304_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x138,"1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",&local_134b);
  data._344_4_ = 2;
  std::__cxx11::string::string((string *)&data.field_0x160,"",&local_134c);
  data._384_4_ = 1;
  std::__cxx11::string::string
            ((string *)&data.field_0x188,
             "02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",&local_134d);
  std::__cxx11::string::string((string *)&data.field_0x1a8,"",&local_134e);
  data.redeem_script._vptr_Script._0_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.redeem_script.script_data_,
             "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",&local_134f)
  ;
  data.redeem_script._40_8_ = 0x500000000;
  std::__cxx11::string::string
            ((string *)&data.redeem_script.field_0x30,"00147dd65592d0ab2fe0d0257d571abf032cd9db93dc"
             ,&local_1350);
  data.key.field_2._M_allocated_capacity._0_4_ = 0;
  std::__cxx11::string::string
            ((string *)(data.key.field_2._M_local_buf + 8),
             "bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",&local_1351);
  data._576_4_ = 4;
  std::__cxx11::string::string((string *)&data.field_0x248,"",&local_1352);
  data._616_4_ = 1;
  std::__cxx11::string::string
            ((string *)&data.field_0x270,
             "02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",&local_1353);
  std::__cxx11::string::string((string *)&data.field_0x290,"",&local_1354);
  data._688_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x2b8,
             "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
             &local_1355);
  data._728_8_ = 0x100000000;
  std::__cxx11::string::string
            ((string *)&data.field_0x2e0,"a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",
             &local_1356);
  data._768_4_ = 0;
  std::__cxx11::string::string
            ((string *)&data.field_0x308,"3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",&local_1357);
  data._808_4_ = 6;
  std::__cxx11::string::string((string *)&data.field_0x330,"",&local_1358);
  std::__cxx11::string::string
            (local_b58,"03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
             &local_1359);
  std::__cxx11::string::string(local_b38,"",&local_135a);
  local_b18 = 0;
  std::__cxx11::string::string
            (local_b10,"combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
             &local_135b);
  local_af0 = 0x600000000;
  std::__cxx11::string::string(local_ae8,"0014751e76e8199196d454941c45d1b3a323f1433bd6",&local_135c)
  ;
  local_ac8 = 0;
  std::__cxx11::string::string(local_ac0,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",&local_135d);
  local_aa0 = 4;
  std::__cxx11::string::string(local_a98,"",&local_135e);
  local_a78 = 1;
  std::__cxx11::string::string
            (local_a70,"0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
             &local_135f);
  std::__cxx11::string::string(local_a50,"",&local_1360);
  local_a30 = 0;
  std::__cxx11::string::string
            (local_a28,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_1361);
  local_a08 = 0x100000000;
  std::__cxx11::string::string
            (local_a00,"a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",&local_1362);
  local_9e0 = 0;
  std::__cxx11::string::string(local_9d8,"39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",&local_1363);
  local_9b8 = 5;
  std::__cxx11::string::string
            (local_9b0,"76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",&local_1364);
  local_990 = 1;
  std::__cxx11::string::string
            (local_988,"02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
             &local_1365);
  std::__cxx11::string::string(local_968,"",&local_1366);
  local_948 = 0;
  std::__cxx11::string::string
            (local_940,
             "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))"
             ,&local_1367);
  local_920 = 0x100000000;
  std::__cxx11::string::string
            (local_918,"a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",&local_1368);
  local_8f8 = 0;
  std::__cxx11::string::string(local_8f0,"3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",&local_1369);
  local_8d0 = 1;
  std::__cxx11::string::string
            (local_8c8,
             "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae"
             ,&local_136a);
  local_8a8 = 0;
  std::__cxx11::string::string(local_8a0,"",&local_136b);
  std::__cxx11::string::string(local_880,"",&local_136c);
  local_860 = 2;
  std::__cxx11::string::string
            (local_858,
             "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))"
             ,&local_136d);
  local_838 = 0x200000000;
  std::__cxx11::string::string
            (local_830,"0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
             &local_136e);
  local_810 = 0;
  std::__cxx11::string::string
            (local_808,"bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",&local_136f)
  ;
  local_7e8 = 3;
  std::__cxx11::string::string
            (local_7e0,
             "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae"
             ,&local_1370);
  local_7c0 = 0;
  std::__cxx11::string::string(local_7b8,"",&local_1371);
  std::__cxx11::string::string(local_798,"",&local_1372);
  local_778 = 2;
  std::__cxx11::string::string
            (local_770,
             "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_1373);
  local_750 = 0x100000000;
  std::__cxx11::string::string
            (local_748,"a914aec509e284f909f769bb7dda299a717c87cc97ac87",&local_1374);
  local_728 = 0;
  std::__cxx11::string::string(local_720,"3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",&local_1375);
  local_700 = 5;
  std::__cxx11::string::string
            (local_6f8,
             "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae"
             ,&local_1376);
  local_6d8 = 0;
  std::__cxx11::string::string(local_6d0,"",&local_1377);
  std::__cxx11::string::string(local_6b0,"",&local_1378);
  local_690 = 1;
  std::__cxx11::string::string
            (local_688,
             "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
             &local_1379);
  local_668 = 0x100000000;
  std::__cxx11::string::string
            (local_660,"a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",&local_137a);
  local_640 = 0;
  std::__cxx11::string::string(local_638,"39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",&local_137b);
  local_618 = 5;
  std::__cxx11::string::string
            (local_610,"76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",&local_137c);
  local_5f0 = 1;
  std::__cxx11::string::string
            (local_5e8,"02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
             &local_137d);
  std::__cxx11::string::string(local_5c8,"",&local_137e);
  local_5a8 = 0;
  std::__cxx11::string::string
            (local_5a0,"addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
             &local_137f);
  local_580 = 0x900000000;
  std::__cxx11::string::string
            (local_578,"0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
             &local_1380);
  local_558 = 0;
  std::__cxx11::string::string
            (local_550,"bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",&local_1381)
  ;
  local_530 = 3;
  std::__cxx11::string::string(local_528,"",&local_1382);
  local_508 = 0;
  std::__cxx11::string::string(local_500,"",&local_1383);
  std::__cxx11::string::string(local_4e0,"",&local_1384);
  local_4c0 = 0;
  std::__cxx11::string::string
            (local_4b8,
             "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj"
             ,&local_1385);
  local_498 = 0xa00000000;
  std::__cxx11::string::string
            (local_490,
             "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e"
             ,&local_1386);
  local_470 = 0;
  std::__cxx11::string::string(local_468,"",&local_1387);
  local_448 = 1;
  std::__cxx11::string::string(local_440,"",&local_1388);
  local_420 = 0;
  std::__cxx11::string::string(local_418,"",&local_1389);
  std::__cxx11::string::string(local_3f8,"",&local_138a);
  local_3d8 = 0;
  std::__cxx11::string::string
            (local_3d0,
             "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))"
             ,&local_138b);
  local_3b0 = 0x100000000;
  std::__cxx11::string::string
            (local_3a8,"a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",&local_138c);
  local_388 = 0;
  std::__cxx11::string::string(local_380,"3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",&local_138d);
  local_360 = 1;
  std::__cxx11::string::string
            (local_358,
             "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac"
             ,&local_138e);
  local_338 = 0;
  std::__cxx11::string::string(local_330,"",&local_138f);
  std::__cxx11::string::string(local_310,"",&local_1390);
  local_2f0 = 0;
  std::__cxx11::string::string
            (local_2e8,"tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
             &local_1391);
  local_2c8 = 0xc00000002;
  std::__cxx11::string::string
            (local_2c0,"5120630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1",
             &local_1392);
  local_2a0 = 0;
  std::__cxx11::string::string
            (local_298,"bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f",
             &local_1393);
  local_278 = 7;
  std::__cxx11::string::string(local_270,"",&local_1394);
  local_250 = 4;
  std::__cxx11::string::string
            (local_248,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
             &local_1395);
  std::__cxx11::string::string(local_228,"",&local_1396);
  local_208 = 0;
  std::__cxx11::string::string
            (local_200,
             "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1)"
             ,&local_1397);
  local_1e0 = 0xc00000000;
  std::__cxx11::string::string
            (local_1d8,"5120acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48",
             &local_1398);
  local_1b8 = 0;
  std::__cxx11::string::string
            (local_1b0,"bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj",&local_1399)
  ;
  local_190 = 7;
  std::__cxx11::string::string(local_188,"",&local_139a);
  local_168 = 2;
  std::__cxx11::string::string
            (local_160,
             "xpub6EKMC2gSMfKgSwn7V9VZn7x1MvoeeVzSmmtSJ4z2L2d6R4WxvdQMouokypZHVp4fgKycrrQnGr6WJ5ED5jG9Q9FiA1q5gKYUc8u6JHJhdo8"
             ,&local_139b);
  std::__cxx11::string::string(local_140,"",&local_139c);
  local_120 = 0;
  std::__cxx11::string::string
            (local_118,
             "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,{c:pk_k(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816),{c:pk_k([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1),thresh(2,c:pk_k(5cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))}})"
             ,&local_139d);
  local_f8 = 0xc00000002;
  std::__cxx11::string::string
            (local_f0,"51204f009acbd8c905be4470df1b92c70be16a71d354ba55cc0e6517853f77d79651",
             &local_139e);
  local_d0 = 0;
  std::__cxx11::string::string
            (local_c8,"bcrt1pfuqf4j7ceyzmu3rsmude93ctu948r565hf2ucrn9z7zn7a7hjegskj3rsv",&local_139f
            );
  local_a8 = 7;
  std::__cxx11::string::string(local_a0,"",&local_13a0);
  local_80 = 4;
  std::__cxx11::string::string
            (local_78,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",&local_13a1
            );
  std::__cxx11::string::string
            (local_58,
             "{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),tl(205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287)}}"
             ,&local_13a2);
  local_38 = 0;
  __l._M_len = 0x10;
  __l._M_array = (iterator)&data;
  std::
  vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
  ::vector(&g_test_cfd_descriptor_data,__l,&local_13a3);
  lVar2 = 0xd98;
  do {
    TestCfdAddressFactoryDescriptorData::~TestCfdAddressFactoryDescriptorData
              ((TestCfdAddressFactoryDescriptorData *)((long)&data.type + lVar2));
    lVar2 = lVar2 + -0xe8;
  } while (lVar2 != -0xe8);
  cfd::DescriptorScriptData::DescriptorScriptData(&data);
  pTVar5 = g_test_cfd_descriptor_data.
           super__Vector_base<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pTVar5 == g_test_cfd_descriptor_data.
                  super__Vector_base<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      cfd::DescriptorScriptData::~DescriptorScriptData(&data);
      std::
      vector<TestCfdAddressFactoryDescriptorData,_std::allocator<TestCfdAddressFactoryDescriptorData>_>
      ::~vector(&g_test_cfd_descriptor_data);
      return;
    }
    TestCfdAddressFactoryDescriptorData::TestCfdAddressFactoryDescriptorData(&test_data,pTVar5);
    cfd::AddressFactory::AddressFactory(&factory,test_data.net_type);
    std::__cxx11::string::string((string *)&gtest_ar_1,"",(allocator *)local_12f0);
    pcVar4 = (char *)0x0;
    cfd::AddressFactory::ParseOutputDescriptor
              ((string *)&gtest_ar,(string *)&factory,(vector *)&test_data,(vector *)&gtest_ar_1,
               (vector *)0x0);
    cfd::DescriptorScriptData::operator=(&data,(DescriptorScriptData *)&gtest_ar);
    cfd::DescriptorScriptData::~DescriptorScriptData((DescriptorScriptData *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    testing::internal::CmpHelperEQ<cfd::core::DescriptorScriptType,cfd::core::DescriptorScriptType>
              ((internal *)&gtest_ar,"test_data.type","data.type",&test_data.type,&data.type);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_data.locking_script","data.locking_script.GetHex()",
               &test_data.locking_script,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"test_data.depth","data.depth",&test_data.depth,&data.depth);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Address::GetAddress_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_data.address","data.address.GetAddress()",
               &test_data.address,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x33f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
              ((internal *)&gtest_ar,"test_data.address_type","data.address_type",
               &test_data.address_type,&data.address_type);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x340,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::Script::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_1,"test_data.redeem_script","data.redeem_script.GetHex()",
               &test_data.redeem_script,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      pcVar3 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x341,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    testing::internal::CmpHelperEQ<cfd::core::DescriptorKeyType,cfd::core::DescriptorKeyType>
              ((internal *)&gtest_ar,"test_data.key_type","data.key_type",&test_data.key_type,
               &data.key_type);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x342,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,"test_data.key","data.key",&test_data.key,&data.key);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x343,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&gtest_ar,"test_data.multisig_req_sig_num","data.multisig_req_sig_num",
               &test_data.multisig_req_sig_num,&data.multisig_req_sig_num);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_1);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_12f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                 ,0x344,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    if (test_data.tree_string._M_string_length == 0) {
      bVar1 = cfd::core::TaprootScriptTree::IsValid();
      gtest_ar_1.success_ = (bool)(bVar1 ^ 1);
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1 != 0) {
        testing::Message::Message((Message *)local_12f0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_1,
                   (AssertionResult *)"data.tree.IsValid()","true","false",pcVar4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_12f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                   ,0x346,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_12f8,(Message *)local_12f0);
        testing::internal::AssertHelper::~AssertHelper(&local_12f8);
        std::__cxx11::string::~string((string *)&gtest_ar);
        this_00 = (DescriptorScriptData *)local_12f0;
        goto LAB_00154597;
      }
    }
    else {
      cfd::core::TapBranch::ToString_abi_cxx11_();
      testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                ((internal *)&gtest_ar_1,"test_data.tree_string","data.tree.ToString()",
                 &test_data.tree_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar4 = "";
        if (gtest_ar_1.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_12f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
                   ,0x348,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_12f0,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_12f0);
        this_00 = (DescriptorScriptData *)&gtest_ar;
LAB_00154597:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    cfd::AddressFactory::~AddressFactory(&factory);
    TestCfdAddressFactoryDescriptorData::~TestCfdAddressFactoryDescriptorData(&test_data);
    pTVar5 = pTVar5 + 1;
  } while( true );
}

Assistant:

TEST(AddressFactory, ParseOutputDescriptor) {
  std::vector<TestCfdAddressFactoryDescriptorData> g_test_cfd_descriptor_data {
    {
      "pk(02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397)#rk5v7uqw",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPk,
      "2102a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397ac",
      0,
      "1FoG2386FG2tAJS9acMuiDsKy67aGg9MKz",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02a5613bd857b7048924264d1e70e08fb2a7e6527d32b7ab1bb993ac59964ff397",
      "",
      0
    },
    {
      "pkh(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptPkh,
      "76a91406afd46bcdfd22ef94ac122aa11f241244a37ecc88ac",
      0,
      "1cMh228HTCiwS8ZsaakH8A8wze1JR5ZsP",
      AddressType::kP2pkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5",
      "",
      0
    },
    {
      "wpkh(02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWpkh,
      "00147dd65592d0ab2fe0d0257d571abf032cd9db93dc",
      0,
      "bc1q0ht9tyks4vh7p5p904t340cr9nvahy7u3re7zg",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02f9308a019258c31049344f85f89d5229b531c845836f99b08601f113bce036f9",
      "",
      0
    },
    {
      "sh(wpkh(03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914cc6ffbc0bf31af759451068f90ba7a0272b6b33287",
      0,
      "3LKyvRN6SmYXGBNn8fcQvYxW9MGKtwcinN",
      AddressType::kP2shP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "03fff97bd5755eeea420453a14355235d382f6472f8568a18b2f057a1460297556",
      "",
      0
    },
    {
      "combo(0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptCombo,
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      0,
      "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",
      AddressType::kP2wpkhAddress,
      "",
      DescriptorKeyType::kDescriptorKeyPublic,
      "0279be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798",
      "",
      0
    },
    {
      "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",
      0,
      "39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",
      AddressType::kP2shP2wshAddress,
      "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
      "",
      0
    },
    {
      "sh(multi(2,022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a01,03acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914a6a8b030a38762f4c1f5cbe387b61a3c5da5cd2687",
      0,
      "3GtEB3yg3r5de2cDJG48SkQwxfxJumKQdN",
      AddressType::kP2shAddress,
      "5221022f01e5e15cca351daff3843fb70f3c2f0a1bdd05e5af888a67784ef3e10a2a012103acd484e2f0c7f65309ad178a9f559abde09796974c57e714c35f110dfc27ccbe52ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      2
    },
    {
      "wsh(multi(2,03a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c7,03774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb,03d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptWsh,
      "0020773d709598b76c4e3b575c08aad40658963f9322affc0f8c28d1d9a68d0c944a",
      0,
      "bc1qwu7hp9vckakyuw6htsy244qxtztrlyez4l7qlrpg68v6drgvj39qn4zazc",
      AddressType::kP2wshAddress,
      "522103a0434d9e47f3c86235477c7b1ae6ae5d3442d49b1943c2b752a68e2a47e247c72103774ae7f858a9411e5ef4246b70c65aac5649980be5c17891bbec17895da008cb2103d01115d548e7561b15c38f004d734633687cf4419620095bc5b0f47070afe85a53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      2
    },
    {
      "sh(wsh(multi(1,03f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa8,03499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e4,02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a914aec509e284f909f769bb7dda299a717c87cc97ac87",
      0,
      "3Hd7YQStg9gYpEt6hgK14ZHUABxSURzeuQ",
      AddressType::kP2shP2wshAddress,
      "512103f28773c2d975288bc7d1d205c3748651b075fbc6610e58cddeeddf8f19405aa82103499fdf9e895e719cfd64e67f07d38e3226aa7b63678949e6e49b241a60e823e42102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e53ae",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      1
    },
    {
      "sh(wsh(pkh(02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a91455e8d5e8ee4f3604aba23c71c2684fa0a56a3a1287",
      0,
      "39XGHYpYmJV9sGFoGHZeU2rLkY6r1MJ6C1",
      AddressType::kP2shP2wshAddress,
      "76a914c42e7ef92fdb603af844d064faad95db9bcdfd3d88ac",
      DescriptorKeyType::kDescriptorKeyPublic,
      "02e493dbf1c10d80f3581e4904930b1404cc6c13900ee0758474fa94abe8c4cd13",
      "",
      0
    },
    {
      "addr(bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptAddr,
      "0020c7a1f1a4d6b4c1802a59631966a18359de779e8a6a65973735a3ccdfdabc407d",
      0,
      "bc1qc7slrfxkknqcq2jevvvkdgvrt8080852dfjewde450xdlk4ugp7szw5tk9",
      AddressType::kP2wshAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      0
    },
    {
      "raw(6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e)#zf2avljj",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptRaw,
      "6a4c4f54686973204f505f52455455524e207472616e73616374696f6e206f7574707574207761732063726561746564206279206d6f646966696564206372656174657261777472616e73616374696f6e2e",
      0,
      "",
      AddressType::kP2shAddress,
      "",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      0
    },
    {
      "sh(c:or_i(andor(c:pk_h(xpub661MyMwAqRbcFW31YEwpkMuc5THy2PSt5bDMsktWQcFF8syAmRUapSCGu8ED9W6oDMSgv6Zz8idoc4a6mr8BDzTJY47LJhkJ8UB7WEGuduB/1/0/44),pk_h(xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/44),pk_h(02c6047f9441ed7d6d3045406e95c07cd85c778e4b8cef3ca7abac09b95c709ee5)),pk_k(02d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e)))",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptSh,
      "a9148019628fc9b183af5d52ed7dc5c6d56fe6a6325f87",
      0,
      "3DNLpswxUiEVyRnAA6mZSvAt7iG6bCu33f",
      AddressType::kP2shAddress,
      "6376a914520e6e72bcd5b616bc744092139bd759c31d6bbe88ac6476a91406afd46bcdfd22ef94ac122aa11f241244a37ecc886776a9145ab62f0be26fe9d6205a155403f33e2ad2d31efe8868672102d7924d4f7d43ea965a465ae3095ff41131e5946f3c85f79e44adbcf8e27e080e68ac",
      DescriptorKeyType::kDescriptorKeyNull,
      "",
      "",
      0
    },
    {
      "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
      NetType::kRegtest,
      DescriptorScriptType::kDescriptorScriptTaproot,
      "5120630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1",
      0,
      "bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f",
      AddressType::kTaprootAddress,
      "",
      DescriptorKeyType::kDescriptorKeySchnorr,
      "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
      "",
      0
    },
    {
      "tr([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1)",
      NetType::kMainnet,
      DescriptorScriptType::kDescriptorScriptTaproot,
      "5120acb99cf4bb397c8aef2fca4f9201053526f5484174fef211ac6ac7fad0a38a48",
      0,
      "bc1p4jueea9m897g4me0ef8eyqg9x5n02jzpwnl0yydvdtrl459r3fyqg8wvnj",
      AddressType::kTaprootAddress,
      "",
      DescriptorKeyType::kDescriptorKeyBip32,
      "xpub6EKMC2gSMfKgSwn7V9VZn7x1MvoeeVzSmmtSJ4z2L2d6R4WxvdQMouokypZHVp4fgKycrrQnGr6WJ5ED5jG9Q9FiA1q5gKYUc8u6JHJhdo8",
      "",
      0
    },
    {
      "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a,{c:pk_k(8c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816),{c:pk_k([bd16bee5/0]xpub69H7F5d8KSRgmmdJg2KhpAK8SR3DjMwAdkxj3ZuxV27CprR9LgpeyGmXUbC6wb7ERfvrnKZjXoUmmDznezpbZb7ap6r1D3tgFxHmwMkQTPH/0/0/1),thresh(2,c:pk_k(5cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bc),s:sha256(e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f),a:hash160(dd69735817e0e3f6f826a9238dc2e291184f0131))}})",
      NetType::kRegtest,
      DescriptorScriptType::kDescriptorScriptTaproot,
      "51204f009acbd8c905be4470df1b92c70be16a71d354ba55cc0e6517853f77d79651",
      0,
      "bcrt1pfuqf4j7ceyzmu3rsmude93ctu948r565hf2ucrn9z7zn7a7hjegskj3rsv",
      AddressType::kTaprootAddress,
      "",
      DescriptorKeyType::kDescriptorKeySchnorr,
      "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",
      "{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),{tl(208c6f5956c3cc7251d483fc683fa06b22d4e2ddc7496a2590acee36c4a313f816ac),tl(205cbdf0646e5db4eaa398f365f2ea7a0e3d419b7e0330e39ce92bddedcac4f9bcac7c82012088a820e38990d0c7fc009880a9c07c23842e886c6bbdc964ce6bdd5817ad357335ee6f87936b82012088a914dd69735817e0e3f6f826a9238dc2e291184f0131876c935287)}}",
      0
    }
  };

  DescriptorScriptData data;
  for (auto test_data : g_test_cfd_descriptor_data) {
    try {
      AddressFactory factory(test_data.net_type);
      data = factory.ParseOutputDescriptor(test_data.descriptor);
      EXPECT_EQ(test_data.type, data.type);
      EXPECT_EQ(test_data.locking_script, data.locking_script.GetHex());
      EXPECT_EQ(test_data.depth, data.depth);
      EXPECT_EQ(test_data.address, data.address.GetAddress());
      EXPECT_EQ(test_data.address_type, data.address_type);
      EXPECT_EQ(test_data.redeem_script, data.redeem_script.GetHex());
      EXPECT_EQ(test_data.key_type, data.key_type);
      EXPECT_EQ(test_data.key, data.key);
      EXPECT_EQ(test_data.multisig_req_sig_num, data.multisig_req_sig_num);
      if (test_data.tree_string.empty()) {
        EXPECT_FALSE(data.tree.IsValid());
      } else {
        EXPECT_EQ(test_data.tree_string, data.tree.ToString());
      }
    } catch (const std::exception& e) {
      EXPECT_STREQ("", e.what());
      EXPECT_STREQ("", test_data.descriptor.c_str());
    }
  }
}